

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyz.h
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyz::NodeIntStateIncrement
          (ChNodeFEAxyz *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = (x->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  uVar8 = (ulong)off_x;
  if ((long)uVar8 < (long)uVar1) {
    uVar2 = (Dv->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if ((long)(ulong)off_v < (long)uVar2) {
      uVar3 = (x_new->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if ((long)uVar8 < (long)uVar3) {
        pdVar4 = (x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        pdVar5 = (Dv->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        pdVar6 = (x_new->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        pdVar6[uVar8] = pdVar4[uVar8] + pdVar5[off_v];
        uVar8 = (ulong)(off_x + 1);
        if ((uVar1 <= uVar8) || (uVar2 <= off_v + 1)) goto LAB_0064b6d4;
        if (uVar8 < uVar3) {
          uVar7 = (ulong)(off_x + 2);
          pdVar6[uVar8] = pdVar4[uVar8] + pdVar5[off_v + 1];
          if ((uVar1 <= uVar7) || (uVar2 <= off_v + 2)) goto LAB_0064b6d4;
          if (uVar7 < uVar3) {
            pdVar6[uVar7] = pdVar4[uVar7] + pdVar5[off_v + 2];
            return;
          }
        }
      }
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
  }
LAB_0064b6d4:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

virtual void NodeIntStateIncrement(const unsigned int off_x,
                                       ChState& x_new,
                                       const ChState& x,
                                       const unsigned int off_v,
                                       const ChStateDelta& Dv) override {
        x_new(off_x) = x(off_x) + Dv(off_v);
        x_new(off_x + 1) = x(off_x + 1) + Dv(off_v + 1);
        x_new(off_x + 2) = x(off_x + 2) + Dv(off_v + 2);
    }